

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

btMatrixX<float> * __thiscall
btMatrixX<float>::negative(btMatrixX<float> *__return_storage_ptr__,btMatrixX<float> *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  
  btMatrixX(__return_storage_ptr__,this->m_rows,this->m_cols);
  uVar2 = this->m_cols;
  iVar7 = __return_storage_ptr__->m_setElemOperations;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar2) {
    uVar9 = (ulong)uVar2;
  }
  uVar6 = (ulong)(uint)this->m_rows;
  if (this->m_rows < 1) {
    uVar6 = uVar8;
  }
  lVar10 = 0;
  for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
    iVar3 = __return_storage_ptr__->m_cols;
    pfVar4 = (__return_storage_ptr__->m_storage).m_data;
    pfVar5 = (this->m_storage).m_data;
    for (lVar12 = 0; uVar9 * 4 != lVar12; lVar12 = lVar12 + 4) {
      uVar1 = *(uint *)((long)pfVar5 + lVar12 + uVar8);
      iVar7 = iVar7 + 1;
      __return_storage_ptr__->m_setElemOperations = iVar7;
      *(uint *)((long)pfVar4 + lVar12 + iVar3 * lVar10) = uVar1 ^ 0x80000000;
    }
    lVar10 = lVar10 + 4;
    uVar8 = uVar8 + (long)(int)uVar2 * 4;
  }
  return __return_storage_ptr__;
}

Assistant:

btMatrixX negative()
	{
		btMatrixX neg(rows(),cols());
		for (int i=0;i<rows();i++)
			for (int j=0;j<cols();j++)
			{
				T v = (*this)(i,j);
				neg.setElem(i,j,-v);
			}
		return neg;
	}